

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TMS320C64xInstPrinter.c
# Opt level: O2

void TMS320C64x_printInst(MCInst *MI,SStream *O,void *Info)

{
  _Bool _Var1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  int64_t iVar6;
  SStream *O_00;
  SStream *extraout_RDX;
  SStream *extraout_RDX_00;
  SStream *extraout_RDX_01;
  SStream *extraout_RDX_02;
  SStream *extraout_RDX_03;
  SStream *extraout_RDX_04;
  SStream *pSVar7;
  char *pcVar8;
  ulong uVar9;
  uint uStack_30;
  
  uVar2 = MCInst_getOpcode(MI);
  uVar3 = uVar2 - 0x102;
  if (uVar3 < 0x13) {
    if ((0x43U >> (uVar3 & 0x1f) & 1) != 0) {
LAB_0023c60c:
      uVar3 = MCInst_getNumOperands(MI);
      if (uVar3 == 3) {
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(MI,1);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,2);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              iVar6 = MCOperand_getImm(pMVar5);
              if (iVar6 == 0) {
                MCInst_setOpcodePub(MI,0x8d);
                MI->size = MI->size + 0xff;
                pcVar8 = "NEG\t";
                goto LAB_0023cb64;
              }
            }
          }
        }
      }
      goto LAB_0023c88b;
    }
    if ((0x54000U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x84U >> (uVar3 & 0x1f) & 1) == 0) goto LAB_0023c319;
      uVar3 = MCInst_getNumOperands(MI);
      if (uVar3 != 3) {
LAB_0023c5ff:
        if (uVar2 == 0x108) goto LAB_0023c60c;
        goto LAB_0023c88b;
      }
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0023c5ff;
      pMVar5 = MCInst_getOperand(MI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0023c5ff;
      pMVar5 = MCInst_getOperand(MI,2);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0023c5ff;
      pMVar5 = MCInst_getOperand(MI,1);
      uVar3 = MCOperand_getReg(pMVar5);
      pMVar5 = MCInst_getOperand(MI,2);
      uVar4 = MCOperand_getReg(pMVar5);
      if (uVar3 != uVar4) goto LAB_0023c5ff;
      MCInst_setOpcodePub(MI,0x90);
      MI->size = MI->size + 0xfe;
LAB_0023c82a:
      pcVar8 = "ZERO\t";
      goto LAB_0023cb84;
    }
    uVar3 = MCInst_getNumOperands(MI);
    if (uVar3 != 3) goto LAB_0023c88b;
    pMVar5 = MCInst_getOperand(MI,0);
    _Var1 = MCOperand_isReg(pMVar5);
    if (!_Var1) goto LAB_0023c88b;
    pMVar5 = MCInst_getOperand(MI,1);
    _Var1 = MCOperand_isReg(pMVar5);
    if (!_Var1) goto LAB_0023c88b;
    pMVar5 = MCInst_getOperand(MI,2);
    _Var1 = MCOperand_isImm(pMVar5);
    if (!_Var1) goto LAB_0023c88b;
    pMVar5 = MCInst_getOperand(MI,2);
    iVar6 = MCOperand_getImm(pMVar5);
    if (iVar6 != -1) goto LAB_0023c88b;
    MCInst_setOpcodePub(MI,0x8e);
    MI->size = MI->size + 0xff;
    pcVar8 = "NOT\t";
LAB_0023cb64:
    SStream_concat0(O,pcVar8);
    uVar3 = 1;
LAB_0023cb6e:
    printOperand(MI,uVar3,O);
LAB_0023cb7a:
    pcVar8 = ", ";
LAB_0023cb84:
    SStream_concat0(O,pcVar8);
switchD_0023ca2d_caseD_1:
    uStack_30 = 0;
  }
  else {
LAB_0023c319:
    uVar3 = uVar2 - 0xa2;
    if (0x12 < uVar3) {
LAB_0023c329:
      if (0x32 < uVar2) {
LAB_0023c7aa:
        if (uVar2 - 0xa0 < 2) goto LAB_0023c7bb;
        goto LAB_0023c88b;
      }
      uVar9 = (ulong)uVar2;
      if ((0x4680000000000U >> (uVar9 & 0x3f) & 1) == 0) {
        if (uVar9 == 0x29) goto LAB_0023c6bd;
        goto LAB_0023c7aa;
      }
      uVar3 = MCInst_getNumOperands(MI);
      if (uVar3 != 3) {
LAB_0023c3b7:
        if ((0x32 < uVar2) || ((0x4600000000000U >> (uVar9 & 0x3f) & 1) == 0)) goto LAB_0023c88b;
        goto LAB_0023c6bd;
      }
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0023c3b7;
      pMVar5 = MCInst_getOperand(MI,1);
      _Var1 = MCOperand_isReg(pMVar5);
      if (!_Var1) goto LAB_0023c3b7;
      pMVar5 = MCInst_getOperand(MI,2);
      _Var1 = MCOperand_isImm(pMVar5);
      if (!_Var1) goto LAB_0023c3b7;
      pMVar5 = MCInst_getOperand(MI,2);
      iVar6 = MCOperand_getImm(pMVar5);
      if (-1 < iVar6) goto LAB_0023c3b7;
      MCInst_setOpcodePub(MI,0x7c);
      pMVar5 = MCInst_getOperand(MI,2);
      iVar6 = MCOperand_getImm(pMVar5);
      MCOperand_setImm(pMVar5,-iVar6);
      SStream_concat0(O,"SUB\t");
      printOperand(MI,1,O);
      pcVar8 = ", ";
      SStream_concat0(O,", ");
      printOperand(MI,2,O);
      goto LAB_0023cb84;
    }
    if ((0xa8U >> (uVar3 & 0x1f) & 1) == 0) {
      if ((0x60000U >> (uVar3 & 0x1f) & 1) != 0) {
        uVar3 = MCInst_getNumOperands(MI);
        if (uVar3 == 3) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,1);
            _Var1 = MCOperand_isReg(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              _Var1 = MCOperand_isReg(pMVar5);
              if (_Var1) {
                pMVar5 = MCInst_getOperand(MI,1);
                uVar3 = MCOperand_getReg(pMVar5);
                pMVar5 = MCInst_getOperand(MI,2);
                uVar2 = MCOperand_getReg(pMVar5);
                if (uVar3 == uVar2) {
                  MCInst_setOpcodePub(MI,0x8f);
                  MI->size = MI->size + 0xff;
                  pcVar8 = "SWAP2\t";
                  goto LAB_0023cb64;
                }
              }
            }
          }
        }
        goto LAB_0023c88b;
      }
      if (uVar3 != 0) goto LAB_0023c329;
    }
    else {
LAB_0023c6bd:
      uVar3 = MCInst_getNumOperands(MI);
      if (uVar3 == 3) {
        pMVar5 = MCInst_getOperand(MI,0);
        _Var1 = MCOperand_isReg(pMVar5);
        if (_Var1) {
          pMVar5 = MCInst_getOperand(MI,1);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,2);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,2);
              iVar6 = MCOperand_getImm(pMVar5);
              if (iVar6 == 0) {
                MCInst_setOpcodePub(MI,0x8c);
                MI->size = MI->size + 0xff;
                pcVar8 = "MV\t";
                goto LAB_0023cb64;
              }
            }
          }
        }
      }
      if (uVar2 - 0xa0 < 2) {
LAB_0023c7bb:
        uVar3 = MCInst_getNumOperands(MI);
        if (uVar3 == 2) {
          pMVar5 = MCInst_getOperand(MI,0);
          _Var1 = MCOperand_isReg(pMVar5);
          if (_Var1) {
            pMVar5 = MCInst_getOperand(MI,1);
            _Var1 = MCOperand_isImm(pMVar5);
            if (_Var1) {
              pMVar5 = MCInst_getOperand(MI,1);
              iVar6 = MCOperand_getImm(pMVar5);
              if (iVar6 == 0) {
                MCInst_setOpcodePub(MI,0x90);
                MI->size = MI->size + 0xff;
                goto LAB_0023c82a;
              }
            }
          }
        }
        goto LAB_0023c88b;
      }
      if (uVar2 != 0xa2) goto LAB_0023c88b;
    }
    uVar3 = MCInst_getNumOperands(MI);
    if (uVar3 == 1) {
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isImm(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(MI,0);
        uVar3 = MCOperand_getReg(pMVar5);
        if (uVar3 == 0x10) {
          MCInst_setOpcodePub(MI,0x8b);
          MI->size = MI->size + 0xff;
          pcVar8 = "IDLE";
          goto LAB_0023c87b;
        }
      }
    }
    uVar3 = MCInst_getNumOperands(MI);
    if (uVar3 == 1) {
      pMVar5 = MCInst_getOperand(MI,0);
      _Var1 = MCOperand_isImm(pMVar5);
      if (_Var1) {
        pMVar5 = MCInst_getOperand(MI,0);
        uVar3 = MCOperand_getReg(pMVar5);
        if (uVar3 == 1) {
          MI->size = MI->size + 0xff;
          pcVar8 = "NOP";
LAB_0023c87b:
          SStream_concat0(O,pcVar8);
          return;
        }
      }
    }
LAB_0023c88b:
    uVar3 = MCInst_getOpcode(MI);
    uVar3 = *(uint *)(printInstruction_OpInfo + (ulong)uVar3 * 4);
    SStream_concat0(O,(char *)((ulong)(uVar3 & 0x3ff) + 0x67791f));
    uVar2 = (uint)O;
    switch(uVar3 >> 10 & 7) {
    case 0:
      goto switchD_0023c8d5_caseD_0;
    case 1:
      printOperand(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0xd & 7) {
      default:
        goto switchD_0023ca08_caseD_0;
      case 1:
        goto switchD_0023ca08_caseD_1;
      case 2:
switchD_0023ca08_caseD_2:
        printOperand(MI,1,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_01;
        switch(uVar3 >> 0x10 & 7) {
        case 0:
          goto switchD_0023c8d5_caseD_0;
        case 1:
          goto switchD_0023ca2d_caseD_1;
        case 3:
          goto switchD_0023ca08_caseD_1;
        case 4:
          goto switchD_0023ca2d_caseD_4;
        case 5:
          goto switchD_0023ca2d_caseD_5;
        case 6:
          goto switchD_0023ca2d_caseD_6;
        case 7:
          goto switchD_0023ca2d_caseD_7;
        }
        goto switchD_0023ca2d_caseD_2;
      case 3:
switchD_0023ca08_caseD_3:
        printOperand(MI,2,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_03;
        switch(uVar3 >> 0x10 & 7) {
        case 0:
          goto switchD_0023c8d5_caseD_0;
        case 2:
          goto switchD_0023ca2d_caseD_2;
        case 3:
          goto switchD_0023ca08_caseD_1;
        case 4:
          goto switchD_0023ca2d_caseD_4;
        case 5:
          goto switchD_0023ca2d_caseD_5;
        case 6:
          goto switchD_0023ca2d_caseD_6;
        case 7:
          goto switchD_0023ca2d_caseD_7;
        }
        break;
      case 4:
switchD_0023ca08_caseD_4:
        printRegPair(MI,1,O);
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_04;
        switch(uVar3 >> 0x10 & 7) {
        case 0:
          goto switchD_0023c8d5_caseD_0;
        case 2:
          goto switchD_0023ca2d_caseD_2;
        case 3:
          goto switchD_0023ca08_caseD_1;
        case 4:
          goto switchD_0023ca2d_caseD_4;
        case 5:
          goto switchD_0023ca2d_caseD_5;
        case 6:
          goto switchD_0023ca2d_caseD_6;
        case 7:
          goto switchD_0023ca2d_caseD_7;
        }
        break;
      case 5:
switchD_0023ca08_caseD_5:
        SStream_concat0(O,", ");
        pSVar7 = extraout_RDX_02;
        switch(uVar3 >> 0x10 & 7) {
        case 0:
          goto switchD_0023c8d5_caseD_0;
        case 2:
          goto switchD_0023ca2d_caseD_2;
        case 3:
          goto switchD_0023ca08_caseD_1;
        case 4:
          goto switchD_0023ca2d_caseD_4;
        case 5:
          goto switchD_0023ca2d_caseD_5;
        case 6:
          goto switchD_0023ca2d_caseD_6;
        case 7:
          goto switchD_0023ca2d_caseD_7;
        }
        break;
      case 6:
        goto switchD_0023c8d5_caseD_0;
      }
      goto switchD_0023ca2d_caseD_1;
    case 2:
      printRegPair(MI,1,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0xd & 7) {
      case 1:
        goto switchD_0023ca08_caseD_1;
      case 2:
        goto switchD_0023ca08_caseD_2;
      case 3:
        goto switchD_0023ca08_caseD_3;
      case 4:
        goto switchD_0023ca08_caseD_4;
      case 5:
        goto switchD_0023ca08_caseD_5;
      case 6:
        goto switchD_0023c8d5_caseD_0;
      }
      break;
    case 3:
      printOperand(MI,2,O);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0xd & 7) {
      case 1:
        goto switchD_0023ca08_caseD_1;
      case 2:
        goto switchD_0023ca08_caseD_2;
      case 3:
        goto switchD_0023ca08_caseD_3;
      case 4:
        goto switchD_0023ca08_caseD_4;
      case 5:
        goto switchD_0023ca08_caseD_5;
      case 6:
        goto switchD_0023c8d5_caseD_0;
      }
      break;
    case 4:
      printOperand(MI,0,O);
      switch(uVar3 >> 0xd & 7) {
      case 1:
        goto switchD_0023ca08_caseD_1;
      case 2:
        goto switchD_0023ca08_caseD_2;
      case 3:
        goto switchD_0023ca08_caseD_3;
      case 4:
        goto switchD_0023ca08_caseD_4;
      case 5:
        goto switchD_0023ca08_caseD_5;
      case 6:
        goto switchD_0023c8d5_caseD_0;
      }
      break;
    case 5:
      printMemOperand(MI,uVar2,O_00);
      SStream_concat0(O,", ");
      switch(uVar3 >> 0xd & 7) {
      case 1:
        goto switchD_0023ca08_caseD_1;
      case 2:
        goto switchD_0023ca08_caseD_2;
      case 3:
        goto switchD_0023ca08_caseD_3;
      case 4:
        goto switchD_0023ca08_caseD_4;
      case 5:
        goto switchD_0023ca08_caseD_5;
      case 6:
        goto switchD_0023c8d5_caseD_0;
      }
      break;
    case 6:
      printMemOperand2(MI,uVar2,O_00);
      goto LAB_0023cb7a;
    case 7:
      printRegPair(MI,0,O);
      SStream_concat0(O,", ");
      pSVar7 = extraout_RDX;
      goto switchD_0023ca2d_caseD_6;
    }
switchD_0023ca08_caseD_0:
    printOperand(MI,0,O);
    pSVar7 = extraout_RDX_00;
    switch(uVar3 >> 0x10 & 7) {
    case 0:
switchD_0023c8d5_caseD_0:
      return;
    case 1:
      goto switchD_0023ca2d_caseD_1;
    case 2:
switchD_0023ca2d_caseD_2:
      SStream_concat0(O,", ");
      uStack_30 = 2;
      break;
    case 3:
switchD_0023ca08_caseD_1:
      printRegPair(MI,0,O);
      return;
    case 4:
switchD_0023ca2d_caseD_4:
      uStack_30 = 1;
      break;
    case 5:
switchD_0023ca2d_caseD_5:
      uVar3 = 3;
      goto LAB_0023cb6e;
    case 6:
switchD_0023ca2d_caseD_6:
      printMemOperand(MI,uVar2,pSVar7);
      return;
    case 7:
switchD_0023ca2d_caseD_7:
      printMemOperand2(MI,uVar2,pSVar7);
      return;
    }
  }
  printOperand(MI,uStack_30,O);
  return;
}

Assistant:

void TMS320C64x_printInst(MCInst *MI, SStream *O, void *Info)
{
	if (!printAliasInstruction(MI, O, Info))
		printInstruction(MI, O, Info);
}